

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinMultGridAnalysis::OneGridAlgorithm(TPZNonLinMultGridAnalysis *this,ostream *out,int nummat)

{
  TPZCompMesh **ppTVar1;
  TPZConservationLaw *this_00;
  long in_RDI;
  string solout;
  REAL sol_tol;
  TPZConservationLaw *law;
  TPZStepSolver<double> finesolver;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> finestiff;
  TPZLinearAnalysis finean;
  int meshdim;
  TPZMaterial *finemat;
  TPZCompMesh *finemesh;
  int setdegree;
  TPZCompMesh *coarcmesh;
  int levelnumbertorefine;
  int marcha;
  int iter;
  undefined4 in_stack_fffffffffffff878;
  DecomposeType in_stack_fffffffffffff87c;
  TPZCompMesh *in_stack_fffffffffffff880;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *this_01;
  ostream *in_stack_fffffffffffff888;
  TPZCompMesh *in_stack_fffffffffffff890;
  TPZCompMesh *in_stack_fffffffffffff898;
  TPZCompMesh *this_02;
  TPZCompMesh *__a;
  TPZStructMatrix *strmatrix;
  TPZLinearAnalysis *in_stack_fffffffffffff8c0;
  string local_738 [8];
  TPZMaterial *in_stack_fffffffffffff8d0;
  TPZCompMesh *in_stack_fffffffffffff8d8;
  TPZNonLinMultGridAnalysis *in_stack_fffffffffffff8e0;
  string *in_stack_fffffffffffff900;
  int in_stack_fffffffffffff90c;
  TPZLinearAnalysis *in_stack_fffffffffffff910;
  TPZMaterial *in_stack_fffffffffffff918;
  int in_stack_fffffffffffff924;
  REAL in_stack_fffffffffffff928;
  TPZNonLinMultGridAnalysis *in_stack_fffffffffffff930;
  int in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  TPZCompMesh *in_stack_fffffffffffffa88;
  TPZAnalysis local_508;
  undefined1 local_69 [37];
  int local_44;
  TPZMaterial *local_40;
  TPZCompMesh *local_38;
  undefined4 local_2c;
  TPZCompMesh *local_28;
  int local_20;
  int local_1c;
  int local_18 [6];
  
  this_02 = (TPZCompMesh *)&std::cout;
  std::operator<<((ostream *)&std::cout,
                  "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n"
                 );
  local_20 = 1;
  std::operator<<((ostream *)this_02,anon_var_dwarf_1874fcc);
  std::istream::operator>>(&std::cin,&local_20);
  ppTVar1 = TPZVec<TPZCompMesh_*>::operator[]((TPZVec<TPZCompMesh_*> *)(in_RDI + 0x488),0);
  local_28 = *ppTVar1;
  local_2c = 0xffffffff;
  local_38 = UniformlyRefineMesh(in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,
                                 in_stack_fffffffffffffa80);
  local_40 = TPZCompMesh::FindMaterial(this_02,(int)((ulong)in_stack_fffffffffffff898 >> 0x20));
  local_44 = TPZCompMesh::Dimension(local_28);
  TPZCompMesh::SetDimModel(local_38,local_44);
  strmatrix = (TPZStructMatrix *)local_69;
  __a = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8c0,(char *)strmatrix,(allocator<char> *)__a);
  TPZCompMesh::SetName
            (in_stack_fffffffffffff880,
             (string *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  TPZCompMesh::Reference(local_38);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffff890);
  TPZCompMesh::LoadReferences(in_stack_fffffffffffff890);
  TPZLinearAnalysis::TPZLinearAnalysis
            ((TPZLinearAnalysis *)this_02,in_stack_fffffffffffff898,
             SUB81((ulong)in_stack_fffffffffffff890 >> 0x38,0),in_stack_fffffffffffff888);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            ((TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)this_02,
             in_stack_fffffffffffff898);
  TPZAnalysis::SetStructuralMatrix(&in_stack_fffffffffffff8c0->super_TPZAnalysis,strmatrix);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)this_02,
             (TPZMatrix<double> *)in_stack_fffffffffffff898);
  TPZStepSolver<double>::TPZStepSolver
            ((TPZStepSolver<double> *)in_stack_fffffffffffff8c0,
             (TPZAutoPointer<TPZMatrix<double>_> *)strmatrix);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffff880);
  TPZStepSolver<double>::SetDirect
            ((TPZStepSolver<double> *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  TPZLinearAnalysis::SetSolver(in_stack_fffffffffffff8c0,(TPZSolver *)strmatrix);
  TPZAnalysis::Solution(&local_508);
  TPZSolutionMatrix::Zero
            ((TPZSolutionMatrix *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  SetDeltaTime(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  if (local_40 == (TPZMaterial *)0x0) {
    this_00 = (TPZConservationLaw *)0x0;
  }
  else {
    this_00 = (TPZConservationLaw *)
              __dynamic_cast(local_40,&TPZMaterial::typeinfo,&TPZConservationLaw::typeinfo,0);
  }
  TPZConservationLaw::SetTimeStep(this_00,-1.0);
  std::operator<<((ostream *)&std::cout,
                  "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n");
  std::istream::operator>>(&std::cin,local_18);
  std::operator<<((ostream *)&std::cout,"\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n"
                 );
  std::istream::operator>>(&std::cin,&local_1c);
  this_01 = (TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)&stack0xfffffffffffff8c7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8c0,(char *)strmatrix,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff8c7);
  SmoothingSolution(in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff924,
                    in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff90c,
                    in_stack_fffffffffffff900);
  std::__cxx11::string::~string(local_738);
  TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1c4dded);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix(this_01);
  TPZLinearAnalysis::~TPZLinearAnalysis((TPZLinearAnalysis *)0x1c4de07);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::OneGridAlgorithm(std::ostream &out,int nummat){
	//ALGORITMO SIMPLES A UMA MALHA
	int iter,marcha;
	cout << "TPZNonLinMultGridAnalysis::OneGridAlgorithm Name of the out dx OneGridAlgorithm.dx\n";
	int levelnumbertorefine = 1;
	cout << "TPZNonLinMultGridAnalysis:: nmero de n�eis a dividir: ";
	cin >> levelnumbertorefine;
	TPZCompMesh *coarcmesh = fMeshes[0];//malha grosseira inicial
	int setdegree = -1;//preserva o grau da malha inicial
	TPZCompMesh *finemesh = UniformlyRefineMesh(coarcmesh,levelnumbertorefine,setdegree);
	TPZMaterial * finemat = finemesh->FindMaterial(nummat);
	int meshdim = coarcmesh->Dimension();
	finemesh->SetDimModel(meshdim);
	finemesh->SetName("\n\t\t\t* * * MALHA COMPUTACIONAL FINA * * *\n\n");
	finemesh->Reference()->ResetReference();
	finemesh->LoadReferences();
	TPZLinearAnalysis finean(finemesh);
	TPZSkylineStructMatrix<STATE> finestiff(finemesh);
	finean.SetStructuralMatrix(finestiff);
	TPZStepSolver<STATE> finesolver;
	finesolver.SetDirect(ELDLt);
	finean.SetSolver(finesolver);
	finean.Solution().Zero();
	SetDeltaTime(finemesh,finemat);//para calcular o passo e estimar o nmero de iterac�s
	TPZConservationLaw *law = dynamic_cast<TPZConservationLaw *>(finemat);
	law->SetTimeStep(-1);//para obter o c�culo antes da primeira soluc�
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Numero de iteracoes ? :\n";
	cin >> iter;
	cout << "\nTPZNonLinMultGridAnalysis::OneGridAlgorithm Marcha ? :\n";
	cin >> marcha;
	REAL sol_tol = 1.e1;//valor m�imo da ||solu�o||
	std::string solout("OneGridAlgorithm.vtk");
//	std::string solout("OneGridAlgorithm.dx");
	SmoothingSolution(sol_tol,iter,finemat,finean,marcha,solout);
}